

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O2

int raplcap_destroy(raplcap *rc)

{
  void *__ptr;
  int iVar1;
  raplcap *prVar2;
  
  prVar2 = &rc_default;
  if (rc != (raplcap *)0x0) {
    prVar2 = rc;
  }
  __ptr = prVar2->state;
  if (__ptr == (void *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = msr_sys_destroy(*(raplcap_msr_sys_ctx **)((long)__ptr + 0x38));
    free(__ptr);
    prVar2->state = (void *)0x0;
  }
  prVar2->nsockets = 0;
  return iVar1;
}

Assistant:

int raplcap_destroy(raplcap* rc) {
  raplcap_msr* state;
  int ret = 0;
  if (rc == NULL) {
    rc = &rc_default;
  }
  if ((state = (raplcap_msr*) rc->state) != NULL) {
    ret = msr_sys_destroy(state->sys);
    free(state);
    rc->state = NULL;
  }
  rc->nsockets = 0;
  raplcap_log(DEBUG, "raplcap_destroy: Destroyed\n");
  return ret;
}